

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

_Bool mi_bitmap_is_claimedx_across
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t count,mi_bitmap_index_t bitmap_idx,
                _Bool *pany_ones,size_t *already_set)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  mi_bitmap_index_t in_RCX;
  long in_RDI;
  byte *in_R8;
  long *in_R9;
  byte bVar4;
  size_t prev;
  mi_bitmap_field_t *field;
  size_t one_count;
  _Bool any_ones;
  _Bool all_ones;
  size_t mid_count;
  size_t post_mask;
  size_t mid_mask;
  size_t pre_mask;
  size_t idx;
  size_t *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  size_t *in_stack_ffffffffffffff90;
  ulong *puVar5;
  ulong *puVar6;
  size_t in_stack_ffffffffffffff98;
  long lVar7;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  byte bVar8;
  undefined1 in_stack_ffffffffffffffa7;
  mi_bitmap_index_t in_stack_ffffffffffffffa8;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  sVar2 = mi_bitmap_index_field(in_RCX);
  sVar3 = mi_bitmap_mask_across
                    (in_stack_ffffffffffffffa8,
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80);
  bVar8 = 0;
  lVar7 = 0;
  puVar6 = (ulong *)(in_RDI + sVar2 * 8);
  puVar5 = puVar6 + 1;
  uVar1 = *puVar6;
  bVar4 = (uVar1 & local_40) == local_40;
  if ((uVar1 & local_40) != 0) {
    bVar8 = 1;
    sVar2 = mi_popcount(uVar1 & local_40);
    lVar7 = sVar2 + lVar7;
  }
  while (sVar2 = sVar3 - 1, sVar3 != 0) {
    puVar6 = puVar5 + 1;
    uVar1 = *puVar5;
    if ((uVar1 & local_48) != local_48) {
      bVar4 = 0;
    }
    puVar5 = puVar6;
    sVar3 = sVar2;
    if ((uVar1 & local_48) != 0) {
      bVar8 = 1;
      sVar3 = mi_popcount(uVar1 & local_48);
      lVar7 = sVar3 + lVar7;
      puVar5 = puVar6;
      sVar3 = sVar2;
    }
  }
  if (local_50 != 0) {
    uVar1 = *puVar5;
    if ((uVar1 & local_50) != local_50) {
      bVar4 = 0;
    }
    if ((uVar1 & local_50) != 0) {
      bVar8 = 1;
      sVar3 = mi_popcount(uVar1 & local_50);
      lVar7 = sVar3 + lVar7;
    }
  }
  if (in_R8 != (byte *)0x0) {
    *in_R8 = bVar8 & 1;
  }
  if (in_R9 != (long *)0x0) {
    *in_R9 = lVar7;
  }
  return (_Bool)(bVar4 & 1);
}

Assistant:

static bool mi_bitmap_is_claimedx_across(mi_bitmap_t bitmap, size_t bitmap_fields, size_t count, mi_bitmap_index_t bitmap_idx, bool* pany_ones, size_t* already_set) {
  size_t idx = mi_bitmap_index_field(bitmap_idx);
  size_t pre_mask;
  size_t mid_mask;
  size_t post_mask;
  size_t mid_count = mi_bitmap_mask_across(bitmap_idx, bitmap_fields, count, &pre_mask, &mid_mask, &post_mask);
  bool all_ones = true;
  bool any_ones = false;
  size_t one_count = 0;
  mi_bitmap_field_t* field = &bitmap[idx];
  size_t prev = mi_atomic_load_relaxed(field++);
  if ((prev & pre_mask) != pre_mask) all_ones = false;
  if ((prev & pre_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & pre_mask); }
  while (mid_count-- > 0) {
    prev = mi_atomic_load_relaxed(field++);
    if ((prev & mid_mask) != mid_mask) all_ones = false;
    if ((prev & mid_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & mid_mask); }
  }
  if (post_mask!=0) {
    prev = mi_atomic_load_relaxed(field);
    if ((prev & post_mask) != post_mask) all_ones = false;
    if ((prev & post_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & post_mask); }
  }
  if (pany_ones != NULL) { *pany_ones = any_ones; }
  if (already_set != NULL) { *already_set = one_count; }
  mi_assert_internal(all_ones ? one_count == count : one_count < count);
  return all_ones;
}